

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::ParseFromArray
          (PerfEventConfig_CallstackSampling *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false> _Var2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint *puVar17;
  ulong *puVar18;
  PerfEventConfig_CallstackSampling *pPVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  bool bVar20;
  Field local_58;
  PerfEventConfig_CallstackSampling *local_48;
  ulong *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (ulong *)(size + (long)raw);
  do {
    lVar8 = 7;
    if (puVar18 <= raw) goto LAB_0024065b;
    uVar11 = (ulong)(char)(byte)*raw;
    puVar10 = (ulong *)((long)raw + 1);
    if ((long)uVar11 < 0) {
      bVar1 = (byte)*raw;
      uVar4 = (ulong)(bVar1 & 0x7f);
      bVar9 = false;
      puVar12 = puVar10;
      for (lVar7 = lVar8;
          (puVar13 = puVar12, uVar11 = uVar4, (char)bVar1 < '\0' &&
          (bVar20 = 0x38 < lVar7 - 7U, bVar9 = bVar20 || puVar18 <= puVar12, size = (size_t)puVar12,
          puVar13 = puVar10, uVar11 = 0, !bVar20 && puVar18 > puVar12)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar12;
        puVar12 = (ulong *)((long)puVar12 + 1);
        uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
        size = (size_t)puVar12;
      }
      puVar10 = puVar13;
      if (bVar9) {
        puVar10 = (ulong *)raw;
        uVar11 = 0;
      }
      if (puVar10 == (ulong *)raw) goto LAB_0024065b;
    }
    uVar3 = (uint)(uVar11 >> 3);
    if ((uVar3 == 0) || (puVar18 <= puVar10)) {
switchD_002404d2_caseD_3:
      bVar9 = false;
      uVar11 = 0;
      local_58.int_value_ = 0;
    }
    else {
      switch((uint)uVar11 & 7) {
      case 0:
        uVar14 = 0;
        bVar9 = puVar10 >= puVar18;
        if (puVar10 < puVar18) {
          size = (long)puVar10 + 1;
          uVar4 = (ulong)((byte)*puVar10 & 0x7f);
          uVar5 = uVar4;
          uVar16 = 0;
          if ((char)(byte)*puVar10 < '\0') {
            uVar5 = 0;
            uVar16 = 0;
            lVar8 = 7;
            puVar12 = (ulong *)size;
            do {
              bVar20 = 0x38 < lVar8 - 7U;
              bVar9 = bVar20 || puVar18 <= puVar12;
              if (bVar20 || puVar18 <= puVar12) goto LAB_00240662;
              uVar15 = *puVar12;
              puVar12 = (ulong *)((long)puVar12 + 1);
              uVar4 = uVar4 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar8 & 0x3f);
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar15 < '\0');
            uVar5 = uVar4 & 0xffffffff;
            size = (size_t)puVar12;
            uVar16 = (uint)(uVar4 >> 0x20);
          }
        }
        else {
          uVar5 = 0;
          uVar16 = 0;
        }
LAB_00240662:
        uVar4 = (ulong)uVar16;
        if (bVar9) {
          size = (size_t)puVar10;
          uVar4 = uVar14;
          uVar5 = uVar14;
        }
        local_40 = (ulong *)raw;
        if ((ulong *)size != puVar10) goto LAB_00240689;
        uVar11 = 0;
        bVar9 = false;
        local_58.int_value_ = uVar14;
        goto LAB_002406cb;
      case 1:
        size = (size_t)(puVar10 + 1);
        if (puVar18 < size) {
LAB_0024065b:
          uVar11 = 0;
          bVar9 = false;
          local_58.int_value_ = 0;
          goto LAB_002406cb;
        }
        uVar5 = *puVar10;
        uVar4 = uVar5 >> 0x20;
        break;
      case 2:
        bVar9 = puVar10 >= puVar18;
        pPVar19 = local_48;
        if (puVar10 < puVar18) {
          bVar1 = (byte)*puVar10;
          uVar4 = (ulong)(bVar1 & 0x7f);
          puVar12 = (ulong *)((long)puVar10 + 1U);
          for (; (size = (size_t)puVar12, pPVar19 = (PerfEventConfig_CallstackSampling *)uVar4,
                 (char)bVar1 < '\0' &&
                 (bVar20 = 0x38 < lVar8 - 7U, bVar9 = bVar20 || puVar18 <= puVar12,
                 size = (size_t)((long)puVar10 + 1U), pPVar19 = local_48,
                 !bVar20 && puVar18 > puVar12)); lVar8 = lVar8 + 7) {
            bVar1 = (byte)*puVar12;
            puVar12 = (ulong *)((long)puVar12 + 1);
            uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
          }
        }
        local_48 = pPVar19;
        if (bVar9) {
          size = (size_t)puVar10;
          local_48 = (PerfEventConfig_CallstackSampling *)0;
        }
        if (((ulong *)size == puVar10) || ((long)puVar18 - size < local_48)) {
          uVar4 = 0;
          uVar5 = 0;
          bVar9 = false;
          uVar14 = 0;
        }
        else {
          uVar4 = size >> 0x20;
          uVar5 = size & 0xffffffff;
          size = size + (long)local_48;
          bVar9 = true;
          uVar14 = (ulong)local_48;
        }
        if (!bVar9) goto LAB_0024065b;
        goto LAB_00240689;
      default:
        goto switchD_002404d2_caseD_3;
      case 5:
        size = (long)puVar10 + 4;
        uVar4 = 0;
        if (puVar18 < size) goto LAB_0024065b;
        uVar5 = (ulong)(uint)*puVar10;
      }
      uVar14 = 0;
LAB_00240689:
      bVar9 = true;
      raw = (void *)size;
      if ((uVar3 < 0x10000) && (uVar14 < 0x10000000)) {
        local_58.int_value_ = uVar5 & 0xffffffff | uVar4 << 0x20;
        uVar11 = uVar14 | (uVar11 >> 3) << 0x20 | (ulong)((uint)uVar11 & 7) << 0x30;
        bVar9 = false;
      }
      else {
        local_58.int_value_ = 0;
        uVar11 = 0;
      }
    }
LAB_002406cb:
    uVar4 = 7;
    puVar17 = &switchD_002404d2::switchdataD_0034dbe0;
    if (!bVar9) {
      local_58.size_ = (uint32_t)uVar11;
      local_58.type_ = (uint8_t)(uVar11 >> 0x30);
      local_58.id_ = (uint16_t)(uVar11 >> 0x20);
      local_38 = dst;
      local_48 = this;
      do {
        if (local_58.id_ == 0) {
          return puVar18 == (ulong *)raw;
        }
        uVar6 = (ushort)(uVar11 >> 0x20);
        if (uVar6 < 4) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar11 >> 0x20) & 0x3f);
        }
        if (uVar6 == 3) {
          this->user_frames_ = (PerfEventConfig_UnwindMode)local_58.int_value_;
        }
        else {
          uVar3 = (uint)(uVar11 >> 0x20) & 0xffff;
          if (uVar3 == 2) {
            this->kernel_frames_ = local_58.int_value_ != 0;
          }
          else if (uVar3 == 1) {
            _Var2._M_head_impl =
                 (this->scope_).ptr_._M_t.
                 super___uniq_ptr_impl<perfetto::protos::gen::PerfEventConfig_Scope,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
                 .super__Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false>.
                 _M_head_impl;
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                      (_Var2._M_head_impl,local_58.int_value_,local_58.size_);
          }
          else {
            protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,dst);
          }
        }
        do {
          if (puVar18 <= raw) goto LAB_00240889;
          uVar11 = (ulong)(char)(byte)*raw;
          puVar10 = (ulong *)((long)raw + 1);
          if ((long)uVar11 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar9 = false;
            uVar11 = uVar5;
            puVar12 = puVar10;
            if ((char)(byte)*raw < '\0') {
              lVar8 = 7;
              puVar13 = puVar10;
              do {
                bVar9 = 0x38 < lVar8 - 7U || puVar18 <= puVar13;
                uVar11 = 0;
                puVar12 = puVar10;
                if (bVar9) break;
                uVar14 = *puVar13;
                puVar12 = (ulong *)((long)puVar13 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar8 & 0x3f);
                lVar8 = lVar8 + 7;
                uVar11 = uVar5;
                puVar13 = puVar12;
              } while ((char)(byte)uVar14 < '\0');
            }
            puVar10 = puVar12;
            if (bVar9) {
              puVar10 = (ulong *)raw;
              uVar11 = 0;
            }
            if (puVar10 == (ulong *)raw) goto LAB_00240889;
          }
          uVar3 = (uint)(uVar11 >> 3);
          if ((uVar3 == 0) || (puVar18 <= puVar10)) {
switchD_00240911_caseD_3:
            local_58.int_value_ = 0;
            bVar9 = false;
            uVar11 = 0;
            goto LAB_00240b1b;
          }
          switch((uint)uVar11 & 7) {
          case 0:
            local_58.int_value_ = 0;
            bVar9 = puVar10 >= puVar18;
            if (puVar10 < puVar18) {
              puVar12 = (ulong *)((long)puVar10 + 1);
              uVar16 = (byte)*puVar10 & 0x7f;
              uVar5 = (ulong)uVar16;
              uVar14 = (ulong)uVar16;
              puVar17 = (uint *)puVar12;
              uVar16 = 0;
              if ((char)(byte)*puVar10 < '\0') {
                uVar14 = 0;
                lVar8 = 7;
                puVar13 = puVar12;
                do {
                  bVar20 = 0x38 < lVar8 - 7U;
                  bVar9 = bVar20 || puVar18 <= puVar13;
                  puVar17 = (uint *)puVar12;
                  uVar16 = 0;
                  if (bVar20 || puVar18 <= puVar13) break;
                  bVar1 = (byte)*puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
                  lVar8 = lVar8 + 7;
                  if (-1 < (char)bVar1) {
                    uVar14 = uVar5 & 0xffffffff;
                  }
                  puVar17 = (uint *)puVar13;
                  uVar16 = (uint)(uVar5 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar14 = 0;
              uVar16 = 0;
            }
            if (bVar9) {
              uVar14 = local_58.int_value_;
            }
            uVar5 = (ulong)uVar16;
            if (bVar9) {
              puVar17 = (uint *)puVar10;
              uVar5 = local_58.int_value_;
            }
            this = local_48;
            uVar15 = local_58.int_value_;
            dst = local_38;
            local_40 = (ulong *)raw;
            if ((ulong *)puVar17 == puVar10) {
              uVar11 = 0;
              bVar9 = false;
            }
            else {
LAB_00240ad0:
              bVar9 = true;
              raw = puVar17;
              if ((uVar3 < 0x10000) && (uVar15 < 0x10000000)) {
                local_58.int_value_ = uVar14 & 0xffffffff | uVar5 << 0x20;
                uVar11 = uVar15 | (uVar11 >> 3) << 0x20 | (uVar11 & 7) << 0x30;
                bVar9 = false;
              }
              else {
                local_58.int_value_ = 0;
                uVar11 = 0;
              }
            }
            break;
          case 1:
            puVar17 = (uint *)(puVar10 + 1);
            if (puVar17 <= puVar18) {
              uVar14 = *puVar10;
              uVar5 = uVar14 >> 0x20;
LAB_00240976:
              uVar15 = 0;
              goto LAB_00240ad0;
            }
            goto LAB_00240889;
          case 2:
            bVar9 = puVar10 >= puVar18;
            uVar5 = uVar4;
            if (puVar10 < puVar18) {
              puVar12 = (ulong *)((long)puVar10 + 1);
              uVar14 = (ulong)((byte)*puVar10 & 0x7f);
              uVar5 = uVar14;
              puVar17 = (uint *)puVar12;
              if ((char)(byte)*puVar10 < '\0') {
                lVar8 = 7;
                puVar13 = puVar12;
                do {
                  bVar9 = 0x38 < lVar8 - 7U || puVar18 <= puVar13;
                  uVar5 = uVar4;
                  puVar17 = (uint *)puVar12;
                  if (bVar9) break;
                  uVar15 = *puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar14 = uVar14 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar8 & 0x3f);
                  lVar8 = lVar8 + 7;
                  uVar5 = uVar14;
                  puVar17 = (uint *)puVar13;
                } while ((char)(byte)uVar15 < '\0');
              }
            }
            uVar4 = uVar5;
            if (bVar9) {
              puVar17 = (uint *)puVar10;
              uVar4 = 0;
            }
            if (((ulong *)puVar17 == puVar10) || ((ulong)((long)puVar18 - (long)puVar17) < uVar4)) {
              uVar14 = 0;
              uVar5 = 0;
              bVar9 = false;
              uVar15 = 0;
            }
            else {
              uVar5 = (ulong)puVar17 >> 0x20;
              uVar14 = (ulong)puVar17 & 0xffffffff;
              puVar17 = (uint *)((long)puVar17 + uVar4);
              bVar9 = true;
              uVar15 = uVar4;
            }
            if (bVar9) goto LAB_00240ad0;
            local_58.int_value_ = 0;
            uVar11 = 0;
            bVar9 = false;
            break;
          default:
            goto switchD_00240911_caseD_3;
          case 5:
            puVar17 = (uint *)((long)puVar10 + 4);
            uVar5 = 0;
            if (puVar17 <= puVar18) {
              uVar14 = (ulong)(uint)*puVar10;
              goto LAB_00240976;
            }
LAB_00240889:
            local_58.int_value_ = 0;
            uVar11 = 0;
            bVar9 = false;
          }
LAB_00240b1b:
        } while (bVar9);
        local_58.size_ = (uint32_t)uVar11;
        local_58.type_ = (uint8_t)(uVar11 >> 0x30);
        local_58.id_ = (uint16_t)(uVar11 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool PerfEventConfig_CallstackSampling::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* scope */:
        (*scope_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* kernel_frames */:
        field.get(&kernel_frames_);
        break;
      case 3 /* user_frames */:
        field.get(&user_frames_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}